

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  type_conflict5 tVar1;
  type_conflict5 tVar2;
  uint uVar3;
  SPxOut *pSVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  bool *pbVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  int t;
  char *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  Verbosity *pVVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *pvVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  Verbosity *pVVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *epsilon_00;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  bool bVar22;
  byte bVar23;
  Real val;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  Verbosity old_verbosity_1;
  int local_ed8;
  bool local_ed4 [4];
  ulong local_ed0;
  cpp_dec_float<200U,_int,_void> local_ec8;
  Verbosity old_verbosity_2;
  undefined1 auStack_e44 [12];
  undefined1 local_e38 [16];
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [13];
  undefined3 uStack_ddb;
  int iStack_dd8;
  bool bStack_dd4;
  ulong local_dd0;
  undefined1 local_dc8 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  Verbosity old_verbosity_5;
  uint uStack_cb4;
  int local_c48;
  bool local_c44;
  ulong local_c40;
  cpp_dec_float<200U,_int,_void> local_c38;
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [16];
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  int local_b48;
  bool local_b44;
  ulong local_b40;
  undefined1 local_b38 [32];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  int local_ac8;
  bool local_ac4;
  ulong local_ac0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_9b0 [4];
  int local_940;
  undefined1 local_93c;
  fpclass_type local_938;
  int32_t iStack_934;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_930 [4];
  int local_8c0;
  undefined1 local_8bc;
  fpclass_type local_8b8;
  int32_t iStack_8b4;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8b0 [4];
  int local_840;
  undefined1 local_83c;
  fpclass_type local_838;
  int32_t iStack_834;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_830 [4];
  int local_7c0;
  undefined1 local_7bc;
  fpclass_type local_7b8;
  int32_t iStack_7b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar23 = 0;
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar4 != (SPxOut *)0x0) && (2 < (int)pSVar4->m_verbosity)) {
    rowratio.m_backend.data._M_elems[0] = 3;
    colratio.m_backend.data._M_elems[0] = pSVar4->m_verbosity;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"Geometric scaling LP");
    pcVar11 = " (persistent)";
    if (!persistent) {
      pcVar11 = "";
    }
    pSVar4 = soplex::operator<<(pSVar4,pcVar11);
    pcVar11 = " with post-equilibration";
    if (this->postequilibration == false) {
      pcVar11 = "";
    }
    pSVar4 = soplex::operator<<(pSVar4,pcVar11);
    std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&colratio);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&colratio,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&rowratio,this,lp);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_bb8,
             &(this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon((Tolerances *)local_bb8._0_8_);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_bb8 + 8));
  tVar1 = boost::multiprecision::operator<(&colratio,&rowratio);
  local_b58 = (undefined1  [16])0x0;
  local_b68 = (undefined1  [16])0x0;
  local_b78 = (undefined1  [16])0x0;
  local_b88 = (undefined1  [16])0x0;
  local_b98 = (undefined1  [16])0x0;
  local_ba8 = (undefined1  [16])0x0;
  local_bb8._0_8_ = (element_type *)0x0;
  local_bb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ad8 = (undefined1  [16])0x0;
  local_ae8 = (undefined1  [16])0x0;
  local_af8 = (undefined1  [16])0x0;
  local_b08 = (undefined1  [16])0x0;
  local_b18 = (undefined1  [16])0x0;
  local_b38._16_16_ = (undefined1  [16])0x0;
  local_b38._0_16_ = (undefined1  [16])0x0;
  pnVar15 = &colratio;
  pnVar13 = &rowratio;
  if (tVar1) {
    pnVar15 = &rowratio;
    pnVar13 = &colratio;
  }
  epsilon_00 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_bb8;
  lVar6 = 0x1c;
  pnVar12 = pnVar13;
  pnVar18 = epsilon_00;
  for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar18->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  local_b48 = (pnVar13->m_backend).exp;
  local_b44 = (pnVar13->m_backend).neg;
  pnVar12 = pnVar15;
  puVar14 = (uint *)local_b38;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar14 = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
    puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
  }
  local_b40._0_4_ = (pnVar13->m_backend).fpclass;
  local_b40._4_4_ = (pnVar13->m_backend).prec_elem;
  local_ac8 = (pnVar15->m_backend).exp;
  local_ac4 = (pnVar15->m_backend).neg;
  local_ac0._0_4_ = (pnVar15->m_backend).fpclass;
  local_ac0._4_4_ = (pnVar15->m_backend).prec_elem;
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
    local_ec8.data._M_elems[0] = 4;
    old_verbosity_1 = pSVar4->m_verbosity;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"before scaling:");
    pSVar4 = soplex::operator<<(pSVar4," min= ");
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_b0,lp,1);
    pSVar4 = soplex::operator<<(pSVar4,&local_b0);
    pSVar4 = soplex::operator<<(pSVar4," max= ");
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_130,lp,1);
    pSVar4 = soplex::operator<<(pSVar4,&local_130);
    pSVar4 = soplex::operator<<(pSVar4," col-ratio= ");
    lVar6 = 0x1c;
    pnVar13 = &colratio;
    pnVar15 = &local_1b0;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = colratio.m_backend.exp;
    local_1b0.m_backend.neg = colratio.m_backend.neg;
    local_1b0.m_backend.fpclass = colratio.m_backend.fpclass;
    local_1b0.m_backend.prec_elem = colratio.m_backend.prec_elem;
    pSVar4 = soplex::operator<<(pSVar4,&local_1b0);
    pSVar4 = soplex::operator<<(pSVar4," row-ratio= ");
    pnVar13 = &rowratio;
    pnVar15 = &local_230;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = rowratio.m_backend.exp;
    local_230.m_backend.neg = rowratio.m_backend.neg;
    local_230.m_backend.fpclass = rowratio.m_backend.fpclass;
    local_230.m_backend.prec_elem = rowratio.m_backend.prec_elem;
    pSVar4 = soplex::operator<<(pSVar4,&local_230);
    std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity_1);
  }
  tVar2 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_b38,&this->m_goodEnoughRatio);
  if (!tVar2) {
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
      local_ec8.data._M_elems[0] = 4;
      old_verbosity_1 = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"No geometric scaling done, ratio good enough");
      std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
      (*((this->
         super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout)->_vptr_SPxOut[2])();
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar4 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
      local_ec8.data._M_elems[0] = 4;
      old_verbosity_1 = pSVar4->m_verbosity;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout," ... but will still perform equilibrium scaling");
      std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
      (*((this->
         super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout)->_vptr_SPxOut[2])();
    }
  }
  uVar3 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity_1,1.0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&rowscale,(ulong)uVar3,(value_type *)&old_verbosity_1,(allocator_type *)&local_ec8);
  uVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity_1,1.0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&colscale,(ulong)uVar3,(value_type *)&old_verbosity_1,(allocator_type *)&local_ec8);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_ec8,0.0,(type *)0x0);
  if (tVar2) {
    lVar6 = 0x1c;
    pVVar17 = (Verbosity *)local_bb8;
    pVVar21 = &old_verbosity_5;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      *pVVar21 = *pVVar17;
      pVVar17 = pVVar17 + (ulong)bVar23 * -2 + 1;
      pVVar21 = pVVar21 + (ulong)bVar23 * -2 + 1;
    }
    local_c48 = local_b48;
    local_c44 = local_b44;
    local_c40 = local_b40;
    puVar14 = (uint *)local_b38;
    pcVar9 = &local_c38;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pcVar9->data)._M_elems[0] = *puVar14;
      puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_c38.exp = local_ac8;
    local_c38.neg = local_ac4;
    local_c38.fpclass = (undefined4)local_ac0;
    local_c38.prec_elem = local_ac0._4_4_;
    pcVar9 = &local_ec8;
    if (tVar1) {
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_1;
    }
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_1;
    if (tVar1) {
      pcVar10 = &local_ec8;
    }
    pnVar13 = &this->m_minImprovement;
    uVar3 = (uint)tVar1;
    local_dc8._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    local_dc8._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    local_dc8._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    local_dc8._12_4_ = 0;
    for (t = 0; t < this->m_maxIterations; t = t + 1) {
      if (tVar1) {
        pnVar15 = &epsilon;
        pvVar19 = local_830;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(uint *)&(pvVar19->
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start =
               (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
          pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *)((long)pvVar19 + (ulong)bVar23 * -8 + 4);
        }
        local_7c0 = epsilon.m_backend.exp;
        local_7bc = epsilon.m_backend.neg;
        local_7b8 = epsilon.m_backend.fpclass;
        iStack_7b4 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,
                   (soplex *)
                   &lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&rowscale,&colscale,local_830,epsilon_00);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
        pVVar17 = &old_verbosity_1;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pVVar17 = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
          pVVar17 = pVVar17 + (ulong)bVar23 * -2 + 1;
        }
        local_ed8 = iStack_dd8;
        local_ed4[0] = bStack_dd4;
        local_ed0 = local_dd0;
        pnVar15 = &epsilon;
        pvVar19 = local_8b0;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(uint *)&(pvVar19->
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start =
               (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
          pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *)((long)pvVar19 + (ulong)bVar23 * -8 + 4);
        }
        local_840 = epsilon.m_backend.exp;
        local_83c = epsilon.m_backend.neg;
        local_838 = epsilon.m_backend.fpclass;
        iStack_834 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,(soplex *)lp,
                   (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&colscale,&rowscale,local_8b0,epsilon_00);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
        pcVar20 = &local_ec8;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
        }
      }
      else {
        pnVar15 = &epsilon;
        pvVar19 = local_930;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(uint *)&(pvVar19->
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start =
               (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
          pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *)((long)pvVar19 + (ulong)bVar23 * -8 + 4);
        }
        local_8c0 = epsilon.m_backend.exp;
        local_8bc = epsilon.m_backend.neg;
        local_8b8 = epsilon.m_backend.fpclass;
        iStack_8b4 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,(soplex *)lp,
                   (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&colscale,&rowscale,local_930,epsilon_00);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
        pVVar17 = &old_verbosity_1;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pVVar17 = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
          pVVar17 = pVVar17 + (ulong)bVar23 * -2 + 1;
        }
        local_ed8 = iStack_dd8;
        local_ed4[0] = bStack_dd4;
        local_ed0 = local_dd0;
        pnVar15 = &epsilon;
        pvVar19 = local_9b0;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(uint *)&(pvVar19->
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start =
               (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
          pvVar19 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *)((long)pvVar19 + (ulong)bVar23 * -8 + 4);
        }
        local_940 = epsilon.m_backend.exp;
        local_93c = epsilon.m_backend.neg;
        local_938 = epsilon.m_backend.fpclass;
        iStack_934 = epsilon.m_backend.prec_elem;
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity_2,
                   (soplex *)
                   &lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&rowscale,&colscale,local_9b0,epsilon_00);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
        pcVar20 = &local_ec8;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
        }
      }
      pSVar4 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      local_ec8.exp = iStack_dd8;
      local_ec8.neg = bStack_dd4;
      local_ec8._120_8_ = local_dd0;
      if ((pSVar4 != (SPxOut *)0x0) && (4 < (int)pSVar4->m_verbosity)) {
        old_verbosity_2 = pSVar4->m_verbosity;
        result_1.m_backend.data._M_elems[0] = 5;
        (*pSVar4->_vptr_SPxOut[2])(pSVar4,&result_1.m_backend);
        pSVar4 = soplex::operator<<((this->
                                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).spxout,"Geometric scaling round ");
        pSVar4 = soplex::operator<<(pSVar4,t);
        pSVar4 = soplex::operator<<(pSVar4," col-ratio= ");
        pcVar16 = pcVar9;
        pnVar15 = &local_a30;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        piVar7 = &local_ec8.exp;
        if (tVar1) {
          piVar7 = &local_ed8;
        }
        local_a30.m_backend.exp = *piVar7;
        pbVar8 = &local_ec8.neg;
        if (tVar1) {
          pbVar8 = local_ed4;
        }
        local_a30.m_backend.neg = *pbVar8;
        local_a30.m_backend._120_8_ =
             local_ed0 & local_dc8._0_8_ | ~local_dc8._0_8_ & local_ec8._120_8_;
        pSVar4 = soplex::operator<<(pSVar4,&local_a30);
        pSVar4 = soplex::operator<<(pSVar4," row-ratio= ");
        pcVar16 = pcVar10;
        pnVar15 = &local_ab0;
        for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4)
          ;
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        piVar7 = &local_ed8;
        if (tVar1) {
          piVar7 = &local_ec8.exp;
        }
        local_ab0.m_backend.exp = *piVar7;
        pbVar8 = local_ed4;
        if (tVar1) {
          pbVar8 = &local_ec8.neg;
        }
        local_ab0.m_backend.neg = *pbVar8;
        local_ab0.m_backend._120_8_ =
             local_ec8._120_8_ & local_dc8._0_8_ | ~local_dc8._0_8_ & local_ed0;
        pSVar4 = soplex::operator<<(pSVar4,&local_ab0);
        std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
        pSVar4 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        (*pSVar4->_vptr_SPxOut[2])(pSVar4,(cpp_dec_float<200U,_int,_void> *)&old_verbosity_2);
      }
      local_dd0 = 0x1c00000000;
      _old_verbosity_2 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08 = (undefined1  [16])0x0;
      local_df8 = (undefined1  [16])0x0;
      local_de8 = SUB1613((undefined1  [16])0x0,0);
      uStack_ddb = 0;
      iStack_dd8 = 0;
      bStack_dd4 = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity_2,&pnVar13->m_backend,
                 (cpp_dec_float<200U,_int,_void> *)&old_verbosity_5);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_1,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2);
      if (tVar2) {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&pnVar13->m_backend,&local_c38);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_ec8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_1.m_backend);
        if (tVar2) break;
      }
      pVVar17 = &old_verbosity_1;
      pVVar21 = &old_verbosity_5;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pVVar21 = *pVVar17;
        pVVar17 = pVVar17 + (ulong)bVar23 * -2 + 1;
        pVVar21 = pVVar21 + (ulong)bVar23 * -2 + 1;
      }
      local_c48 = local_ed8;
      local_c44 = local_ed4[0];
      local_c40 = local_ed0;
      pcVar16 = &local_ec8;
      pcVar20 = &local_c38;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar20->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4);
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_c38.exp = local_ec8.exp;
      local_c38.neg = local_ec8.neg;
      local_c38.fpclass = local_ec8.fpclass;
      local_c38.prec_elem = local_ec8.prec_elem;
    }
    local_dd0 = 0x1c00000000;
    _old_verbosity_2 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8 = (undefined1  [16])0x0;
    local_de8 = SUB1613((undefined1  [16])0x0,0);
    uStack_ddb = 0;
    iStack_dd8 = 0;
    bStack_dd4 = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)&old_verbosity_2,&pnVar13->m_backend,
               (cpp_dec_float<200U,_int,_void> *)local_bb8);
    tVar1 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&old_verbosity_1,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&old_verbosity_2);
    if (!tVar1) {
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&pnVar13->m_backend,(cpp_dec_float<200U,_int,_void> *)local_b38
                );
      tVar1 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_ec8,&result_1);
      if (!tVar1) goto LAB_0042e9fd;
      vecExp_00 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_activeColscaleExp;
      vecExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
      if ((this->postequilibration & 1U) != 0) goto LAB_0042ea53;
      goto LAB_0042ea9e;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    if (this->postequilibration == false) goto LAB_0042ea9e;
LAB_0042ea53:
    pnVar13 = &epsilon;
    pnVar15 = &local_2b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = epsilon.m_backend.exp;
    local_2b0.m_backend.neg = epsilon.m_backend.neg;
    local_2b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_2b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computePostequiExpVecs(lp,&rowscale,&colscale,vecExp,vecExp_00,&local_2b0);
  }
  else {
LAB_0042e9fd:
    bVar22 = this->postequilibration == false;
    if (bVar22) {
      pSVar4 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
        _old_verbosity_5 = (double)CONCAT44(uStack_cb4,pSVar4->m_verbosity);
        local_c38.data._M_elems[0] = 4;
        (*pSVar4->_vptr_SPxOut[2])();
        pSVar4 = soplex::operator<<((this->
                                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).spxout,"No geometric scaling done.");
        std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
        pSVar4 = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity_5);
      }
      lp->_isScaled = true;
      goto LAB_0042edb8;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    if (!bVar22) {
      _old_verbosity_5 = 1.0;
      std::
      __fill_a1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>*,double>
                (rowscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 rowscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(double *)&old_verbosity_5);
      _old_verbosity_5 = 1.0;
      std::
      __fill_a1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>*,double>
                (colscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 colscale.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(double *)&old_verbosity_5);
      goto LAB_0042ea53;
    }
LAB_0042ea9e:
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&colscale,vecExp_00);
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&rowscale,vecExp);
  }
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar4 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if (pSVar4 != (SPxOut *)0x0) {
    if (4 < (int)pSVar4->m_verbosity) {
      _old_verbosity_5 = (double)CONCAT44(uStack_cb4,pSVar4->m_verbosity);
      local_c38.data._M_elems[0] = 5;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"Row scaling min= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_330,this);
      pSVar4 = soplex::operator<<(pSVar4,&local_330);
      pSVar4 = soplex::operator<<(pSVar4," max= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_3b0,this);
      pSVar4 = soplex::operator<<(pSVar4,&local_3b0);
      std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
      pSVar4 = soplex::operator<<(pSVar4,"IGEOSC06 Col scaling min= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_430,this);
      pSVar4 = soplex::operator<<(pSVar4,&local_430);
      pSVar4 = soplex::operator<<(pSVar4," max= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_4b0,this);
      pSVar4 = soplex::operator<<(pSVar4,&local_4b0);
      std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
      pSVar4 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity_5);
      pSVar4 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if (pSVar4 == (SPxOut *)0x0) goto LAB_0042edb8;
    }
    if (3 < (int)pSVar4->m_verbosity) {
      _old_verbosity_5 = (double)CONCAT44(uStack_cb4,pSVar4->m_verbosity);
      local_c38.data._M_elems[0] = 4;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"after scaling: ");
      pSVar4 = soplex::operator<<(pSVar4," min= ");
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_530,lp,0);
      pSVar4 = soplex::operator<<(pSVar4,&local_530);
      pSVar4 = soplex::operator<<(pSVar4," max= ");
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_5b0,lp,0);
      pSVar4 = soplex::operator<<(pSVar4,&local_5b0);
      pSVar4 = soplex::operator<<(pSVar4," col-ratio= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_630,this,lp);
      pSVar4 = soplex::operator<<(pSVar4,&local_630);
      pSVar4 = soplex::operator<<(pSVar4," row-ratio= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_6b0,this,lp);
      pSVar4 = soplex::operator<<(pSVar4,&local_6b0);
      std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
      pSVar4 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity_5);
    }
  }
LAB_0042edb8:
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base(&colscale.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 );
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base(&rowscale.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 );
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}